

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O0

void __thiscall
OpenMD::ifstrstream::ifstrstream(ifstrstream *this,char *filename,openmode mode,bool checkFilename)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  _Ios_Openmode in_EDX;
  char *in_RSI;
  long *in_RDI;
  undefined1 in_stack_ffffffffffffffab;
  openmode in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  
  std::ios::ios((ios *)(in_RDI + 0x2e));
  std::istream::istream(in_RDI,(streambuf *)&PTR_construction_vtable_24__00341cd8);
  *in_RDI = (long)&PTR__ifstrstream_00341c98;
  in_RDI[0x2e] = (long)&PTR__ifstrstream_00341cc0;
  std::__cxx11::stringbuf::stringbuf((stringbuf *)(in_RDI + 2));
  std::filebuf::filebuf((filebuf *)(in_RDI + 0xf));
  *(undefined1 *)(in_RDI + 0x2d) = 0;
  std::ios::init((streambuf *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  _Var2 = std::operator|(in_EDX,_S_in);
  bVar1 = internalOpen((ifstrstream *)CONCAT44(_Var2,in_stack_ffffffffffffffb8),in_RSI,
                       in_stack_ffffffffffffffac,(bool)in_stack_ffffffffffffffab);
  *(bool *)(in_RDI + 0x2d) = bVar1;
  return;
}

Assistant:

ifstrstream::ifstrstream(const char* filename, std::ios_base::openmode mode,
                           bool checkFilename) :
      std::basic_istream<char, std::char_traits<char>>(0),
      internalFileBuf_(), isRead(false) {
    this->init(&internalFileBuf_);
#if defined(_MSC_VER)
    isRead =
        internalOpen(filename, mode | std::ios_base::in | std::ios_base::binary,
                     checkFilename);
#else
    isRead = internalOpen(filename, mode | std::ios_base::in, checkFilename);
#endif
  }